

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_36::HttpClientAdapter::request
          (Request *__return_storage_ptr__,HttpClientAdapter *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  HttpService *pHVar1;
  SourceLocation location;
  SourceLocation location_00;
  HttpMethod HVar2;
  Own<kj::PromiseFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *params_1;
  ResponseImpl *this_00;
  Promise<void> *pPVar3;
  RefOrVoid<kj::HttpHeaders> pHVar4;
  RefOrVoid<kj::AsyncInputStream> pAVar5;
  RefOrVoid<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> pRVar6;
  Own<kj::AsyncInputStream,_std::nullptr_t> *attachments_1;
  Own<kj::HttpHeaders,_std::nullptr_t> *attachments_2;
  PromiseFulfiller<kj::Promise<void>_> *pPVar7;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *other;
  HttpClientAdapter *pHVar8;
  undefined4 in_register_00000014;
  void *__child_stack;
  char *__arg;
  undefined8 in_stack_fffffffffffffdd0;
  StringPtr local_1a8;
  Own<kj::AsyncInputStream,_std::nullptr_t> local_198;
  Promise<void> promise;
  SourceLocation local_178;
  undefined1 local_160 [8];
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> responder;
  SourceLocation local_130;
  undefined1 local_118 [8];
  PromiseFulfillerPair<kj::HttpClient::Response> paf;
  undefined1 local_f0 [8];
  OneWayPipe pipe;
  HttpHeaders local_c0;
  undefined1 local_60 [8];
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  String urlCopy;
  HttpHeaders *headers_local;
  HttpClientAdapter *pHStack_28;
  HttpMethod method_local;
  HttpClientAdapter *this_local;
  StringPtr url_local;
  
  __arg = (char *)url.content.size_;
  pHVar8 = (HttpClientAdapter *)url.content.ptr;
  headers_local._4_4_ = method;
  pHStack_28 = this;
  this_local = pHVar8;
  url_local.content.ptr = __arg;
  url_local.content.size_ = (size_t)__return_storage_ptr__;
  str<kj::StringPtr&>((String *)&headersCopy.ptr,(kj *)&this_local,
                      (StringPtr *)CONCAT44(in_register_00000014,method));
  HttpHeaders::clone(&local_c0,(__fn *)headers,__child_stack,(int)pHVar8,__arg);
  heap<kj::HttpHeaders>((kj *)local_60,&local_c0);
  HttpHeaders::~HttpHeaders(&local_c0);
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)&paf.fulfiller.ptr,expectedBodySize);
  newOneWayPipe((OneWayPipe *)local_f0,(Maybe<unsigned_long> *)&paf.fulfiller.ptr);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&paf.fulfiller.ptr);
  SourceLocation::SourceLocation
            (&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"request",0x1a39,0x10);
  location.function = (char *)local_130._16_8_;
  location.fileName = local_130.function;
  location.lineNumber = (int)in_stack_fffffffffffffdd0;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  newPromiseAndFulfiller<kj::HttpClient::Response>(location);
  params_1 = mv<kj::Own<kj::PromiseFulfiller<kj::HttpClient::Response>,decltype(nullptr)>>
                       ((Own<kj::PromiseFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *)&paf)
  ;
  refcounted<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,kj::HttpMethod&,kj::Own<kj::PromiseFulfiller<kj::HttpClient::Response>,decltype(nullptr)>>
            ((kj *)&requestPaf.fulfiller.ptr,(HttpMethod *)((long)&headers_local + 4),params_1);
  SourceLocation::SourceLocation
            (&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"request",0x1a3c,0x17);
  location_00.function = (char *)local_178._16_8_;
  location_00.fileName = local_178.function;
  location_00.lineNumber = (int)in_stack_fffffffffffffdd0;
  location_00.columnNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  newPromiseAndFulfiller<kj::Promise<void>>(location_00);
  this_00 = Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>::
            operator->((Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>
                        *)&requestPaf.fulfiller.ptr);
  pPVar3 = mv<kj::Promise<void>>((Promise<void> *)local_160);
  Promise<void>::Promise(&promise,pPVar3);
  ResponseImpl::setPromise(this_00,&promise);
  Promise<void>::~Promise(&promise);
  HVar2 = headers_local._4_4_;
  pHVar1 = this->service;
  StringPtr::StringPtr(&local_1a8,(String *)&headersCopy.ptr);
  pHVar4 = Own<kj::HttpHeaders,_std::nullptr_t>::operator*
                     ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  pAVar5 = Own<kj::AsyncInputStream,_std::nullptr_t>::operator*
                     ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_f0);
  pRVar6 = Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>::
           operator*((Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>
                      *)&requestPaf.fulfiller.ptr);
  (**pHVar1->_vptr_HttpService)
            (&local_198,pHVar1,(ulong)HVar2,local_1a8.content.ptr,local_1a8.content.size_,pHVar4,
             pAVar5,pRVar6);
  attachments_1 =
       mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                 ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_f0);
  attachments_2 = (Own<kj::HttpHeaders,_std::nullptr_t> *)mv<kj::String>((String *)&headersCopy.ptr)
  ;
  mv<kj::Own<kj::HttpHeaders,decltype(nullptr)>>((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  Promise<void>::
  attach<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            ((Promise<void> *)&local_198.ptr,&local_198,(String *)attachments_1,attachments_2);
  Promise<void>::~Promise((Promise<void> *)&local_198);
  pPVar7 = Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t> *)&requestPaf);
  pPVar3 = mv<kj::Promise<void>>((Promise<void> *)&local_198.ptr);
  (*(pPVar7->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar7,pPVar3);
  other = mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                    ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&pipe.in.ptr);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::Own(&__return_storage_ptr__->body,other);
  mv<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> *)
             &requestPaf.fulfiller.ptr);
  Promise<kj::HttpClient::Response>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>
            (&__return_storage_ptr__->response,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> *)
             local_118);
  Promise<void>::~Promise((Promise<void> *)&local_198.ptr);
  PromiseFulfillerPair<kj::Promise<void>_>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::Promise<void>_> *)local_160);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> *)
             &requestPaf.fulfiller.ptr);
  PromiseFulfillerPair<kj::HttpClient::Response>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::HttpClient::Response> *)local_118);
  OneWayPipe::~OneWayPipe((OneWayPipe *)local_f0);
  Own<kj::HttpHeaders,_std::nullptr_t>::~Own((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  String::~String((String *)&headersCopy.ptr);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());

    auto pipe = newOneWayPipe(expectedBodySize);

    // TODO(cleanup): The ownership relationships here are a mess. Can we do something better
    //   involving a PromiseAdapter, maybe?
    auto paf = kj::newPromiseAndFulfiller<Response>();
    auto responder = kj::refcounted<ResponseImpl>(method, kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto promise = service.request(method, urlCopy, *headersCopy, *pipe.in, *responder)
        .attach(kj::mv(pipe.in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return {
      kj::mv(pipe.out),
      paf.promise.attach(kj::mv(responder))
    };
  }